

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts
minmax_floats(FloatParts a,FloatParts b,_Bool ismin,_Bool ieee,_Bool ismag,float_status *s)

{
  _Bool _Var1;
  ulong uVar2;
  ulong uVar3;
  FloatParts FVar4;
  _Bool local_47;
  bool local_46;
  bool local_45;
  int local_44;
  _Bool a_less_1;
  int32_t iStack_40;
  _Bool a_less;
  int b_exp;
  int a_exp;
  _Bool ismag_local;
  _Bool ieee_local;
  _Bool ismin_local;
  FloatParts b_local;
  FloatParts a_local;
  
  uVar2 = b.frac;
  uVar3 = a.frac;
  a_local.frac._0_4_ = a.exp;
  a_local.frac._4_1_ = a.cls;
  a_local.frac._5_1_ = a.sign;
  b_local.frac._0_4_ = b.exp;
  b_local.frac._4_1_ = b.cls;
  b_local.frac._5_1_ = b.sign;
  _Var1 = is_nan(a_local.frac._4_1_);
  local_47 = true;
  if (!_Var1) {
    local_47 = is_nan(b_local.frac._4_1_);
  }
  if (local_47 != false) {
    if (ieee) {
      _Var1 = is_snan(a_local.frac._4_1_);
      if ((_Var1) || (_Var1 = is_snan(b_local.frac._4_1_), _Var1)) {
        FVar4 = pick_nan(a,b,s);
        return FVar4;
      }
      _Var1 = is_nan(a_local.frac._4_1_);
      if ((_Var1) && (_Var1 = is_nan(b_local.frac._4_1_), !_Var1)) {
        return b;
      }
      _Var1 = is_nan(b_local.frac._4_1_);
      if ((_Var1) && (_Var1 = is_nan(a_local.frac._4_1_), !_Var1)) {
        return a;
      }
    }
    FVar4 = pick_nan(a,b,s);
    return FVar4;
  }
  if (a_local.frac._4_1_ == float_class_zero) {
    iStack_40 = -0x80000000;
  }
  else if (a_local.frac._4_1_ == float_class_normal) {
    iStack_40 = (int32_t)a_local.frac;
  }
  else {
    if (a_local.frac._4_1_ != float_class_inf) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0xb30,(char *)0x0);
    }
    iStack_40 = 0x7fffffff;
  }
  if (b_local.frac._4_1_ == float_class_zero) {
    local_44 = -0x80000000;
  }
  else if (b_local.frac._4_1_ == float_class_normal) {
    local_44 = (int32_t)b_local.frac;
  }
  else {
    if (b_local.frac._4_1_ != float_class_inf) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0xb3e,(char *)0x0);
    }
    local_44 = 0x7fffffff;
  }
  if ((ismag) && ((iStack_40 != local_44 || (uVar3 != uVar2)))) {
    local_45 = iStack_40 < local_44;
    if (iStack_40 == local_44) {
      local_45 = uVar3 < uVar2;
    }
    if (local_45 == ismin) {
      return a;
    }
    return b;
  }
  if ((a_local.frac._5_1_ & 1U) != (b_local.frac._5_1_ & 1U)) {
    if ((_Bool)(a_local.frac._5_1_ & 1U) == ismin) {
      return a;
    }
    return b;
  }
  local_46 = iStack_40 < local_44;
  if (iStack_40 == local_44) {
    local_46 = uVar3 < uVar2;
  }
  if ((_Bool)(a_local.frac._5_1_ & 1U ^ local_46) == ismin) {
    return a;
  }
  return b;
}

Assistant:

static FloatParts minmax_floats(FloatParts a, FloatParts b, bool ismin,
                                bool ieee, bool ismag, float_status *s)
{
    if (unlikely(is_nan(a.cls) || is_nan(b.cls))) {
        if (ieee) {
            /* Takes two floating-point values `a' and `b', one of
             * which is a NaN, and returns the appropriate NaN
             * result. If either `a' or `b' is a signaling NaN,
             * the invalid exception is raised.
             */
            if (is_snan(a.cls) || is_snan(b.cls)) {
                return pick_nan(a, b, s);
            } else if (is_nan(a.cls) && !is_nan(b.cls)) {
                return b;
            } else if (is_nan(b.cls) && !is_nan(a.cls)) {
                return a;
            }
        }
        return pick_nan(a, b, s);
    } else {
        int a_exp = 0, b_exp = 0;

        switch (a.cls) {
        case float_class_normal:
            a_exp = a.exp;
            break;
        case float_class_inf:
            a_exp = INT_MAX;
            break;
        case float_class_zero:
            a_exp = INT_MIN;
            break;
        default:
            g_assert_not_reached();
            break;
        }
        switch (b.cls) {
        case float_class_normal:
            b_exp = b.exp;
            break;
        case float_class_inf:
            b_exp = INT_MAX;
            break;
        case float_class_zero:
            b_exp = INT_MIN;
            break;
        default:
            g_assert_not_reached();
            break;
        }

        if (ismag && (a_exp != b_exp || a.frac != b.frac)) {
            bool a_less = a_exp < b_exp;
            if (a_exp == b_exp) {
                a_less = a.frac < b.frac;
            }
            return a_less ^ ismin ? b : a;
        }

        if (a.sign == b.sign) {
            bool a_less = a_exp < b_exp;
            if (a_exp == b_exp) {
                a_less = a.frac < b.frac;
            }
            return a.sign ^ a_less ^ ismin ? b : a;
        } else {
            return a.sign ^ ismin ? b : a;
        }
    }
}